

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBlendTests.cpp
# Opt level: O1

int __thiscall deqp::gles3::Functional::BlendCase::init(BlendCase *this,EVP_PKEY_CTX *ctx)

{
  TextureFormat *pTVar1;
  Vec4 *pVVar2;
  Vec4 *pVVar3;
  ostringstream *this_00;
  int iVar4;
  int extraout_EAX;
  GLenum GVar5;
  int extraout_EAX_00;
  RenderTarget *pRVar6;
  undefined8 uVar7;
  QuadRenderer *this_01;
  ReferenceQuadRenderer *this_02;
  TextureLevel *this_03;
  int iVar8;
  ChannelOrder CVar9;
  BlendCase *this_04;
  Vec4 *pVVar10;
  int i;
  long lVar11;
  int i_1;
  long lVar12;
  int i_4;
  Vector<float,_4> res;
  Vector<float,_4> res_1;
  Vector<float,_4> res_3;
  Vector<float,_4> res_2;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  float local_1b8 [8];
  undefined1 local_198 [8];
  TextureFormat TStack_190;
  ios_base local_120 [264];
  
  CVar9 = RGBA;
  this_04 = this;
  if (this->m_useSrgbFbo == false) {
    this_04 = (BlendCase *)(this->super_TestCase).m_context;
    pRVar6 = Context::getRenderTarget((Context *)this_04);
    CVar9 = RGBA - ((pRVar6->m_pixelFormat).alphaBits == 0);
  }
  if (init()::baseGradientColors == '\0') {
    init((EVP_PKEY_CTX *)this_04);
  }
  pVVar10 = init::baseGradientColors;
  lVar11 = 0;
  do {
    local_1d8 = 0;
    uStack_1d0 = 0;
    lVar12 = 0;
    do {
      *(float *)((long)&local_1d8 + lVar12 * 4) = pVVar10->m_data[lVar12] + -0.5;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 4);
    local_1c8 = 0;
    uStack_1c0 = 0;
    lVar12 = 0;
    do {
      *(float *)((long)&local_1c8 + lVar12 * 4) = *(float *)((long)&local_1d8 + lVar12 * 4) * 0.2;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 4);
    local_198._0_4_ = R;
    local_198._4_4_ = SNORM_INT8;
    TStack_190.order = R;
    TStack_190.type = SNORM_INT8;
    lVar12 = 0;
    do {
      *(float *)(local_198 + lVar12 * 4) = *(float *)((long)&local_1c8 + lVar12 * 4) + 0.5;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 4);
    pTVar1 = (TextureFormat *)((this->m_firstQuad).color + lVar11);
    pTVar1->order = local_198._0_4_;
    pTVar1->type = local_198._4_4_;
    pTVar1[1] = TStack_190;
    pVVar2 = (this->m_firstQuad).color + lVar11;
    uVar7 = *(undefined8 *)(pVVar2->m_data + 2);
    pVVar3 = (this->m_firstQuadInt).color + lVar11;
    *(undefined8 *)pVVar3->m_data = *(undefined8 *)pVVar2->m_data;
    *(undefined8 *)(pVVar3->m_data + 2) = uVar7;
    lVar12 = 0;
    do {
      local_1b8[lVar12 + 4] = 1.0;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 4);
    local_1b8[0] = 0.0;
    local_1b8[1] = 0.0;
    local_1b8[2] = 0.0;
    local_1b8[3] = 0.0;
    lVar12 = 0;
    do {
      local_1b8[lVar12] = local_1b8[lVar12 + 4] - pVVar10->m_data[lVar12];
      lVar12 = lVar12 + 1;
    } while (lVar12 != 4);
    local_1d8 = 0;
    uStack_1d0 = 0;
    lVar12 = 0;
    do {
      *(float *)((long)&local_1d8 + lVar12 * 4) = local_1b8[lVar12] + -0.5;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 4);
    local_1c8 = local_1d8;
    uStack_1c0 = uStack_1d0;
    local_198._0_4_ = R;
    local_198._4_4_ = SNORM_INT8;
    TStack_190.order = R;
    TStack_190.type = SNORM_INT8;
    lVar12 = 0;
    do {
      *(float *)(local_198 + lVar12 * 4) = *(float *)((long)&local_1c8 + lVar12 * 4) + 0.5;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 4);
    pTVar1 = (TextureFormat *)((this->m_secondQuad).color + lVar11);
    pTVar1->order = local_198._0_4_;
    pTVar1->type = local_198._4_4_;
    pTVar1[1] = TStack_190;
    pVVar2 = (this->m_secondQuad).color + lVar11;
    uVar7 = *(undefined8 *)(pVVar2->m_data + 2);
    pVVar3 = (this->m_secondQuadInt).color + lVar11;
    *(undefined8 *)pVVar3->m_data = *(undefined8 *)pVVar2->m_data;
    *(undefined8 *)(pVVar3->m_data + 2) = uVar7;
    lVar11 = lVar11 + 1;
    pVVar10 = pVVar10 + 1;
  } while (lVar11 != 4);
  iVar4 = this->m_renderWidth;
  if (0x3f < iVar4) {
    iVar4 = 0x40;
  }
  this->m_viewportWidth = iVar4;
  iVar8 = 0x40;
  if (this->m_renderHeight < 0x40) {
    iVar8 = this->m_renderHeight;
  }
  this->m_viewportHeight = iVar8;
  *(undefined8 *)(this->m_firstQuadInt).posA.m_data = 0;
  *(undefined8 *)(this->m_secondQuadInt).posA.m_data = 0;
  uVar7 = CONCAT44(iVar8 + -1,iVar4 + -1);
  *(undefined8 *)(this->m_firstQuadInt).posB.m_data = uVar7;
  *(undefined8 *)(this->m_secondQuadInt).posB.m_data = uVar7;
  this_01 = (QuadRenderer *)operator_new(0x20);
  deqp::gls::FragmentOpUtil::QuadRenderer::QuadRenderer
            (this_01,((this->super_TestCase).m_context)->m_renderCtx,GLSL_VERSION_300_ES);
  this->m_renderer = this_01;
  this_02 = (ReferenceQuadRenderer *)operator_new(0x11108);
  deqp::gls::FragmentOpUtil::ReferenceQuadRenderer::ReferenceQuadRenderer(this_02);
  this->m_referenceRenderer = this_02;
  this_03 = (TextureLevel *)operator_new(0x28);
  if (this->m_useSrgbFbo != false) {
    CVar9 = sRGBA;
  }
  local_198._4_4_ = UNORM_INT8;
  local_198._0_4_ = CVar9;
  tcu::TextureLevel::TextureLevel
            (this_03,(TextureFormat *)local_198,this->m_viewportWidth,this->m_viewportHeight,1);
  this->m_refColorBuffer = this_03;
  this->m_curParamSetNdx = 0;
  iVar4 = extraout_EAX;
  if (this->m_useSrgbFbo == true) {
    local_198 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"Using FBO of size (",0x13);
    std::ostream::operator<<(this_00,this->m_renderWidth);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::operator<<(this_00,this->m_renderHeight);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,") with format GL_SRGB8_ALPHA8",0x1d);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x78));
    glwGenRenderbuffers(1,&this->m_colorRbo);
    GVar5 = glwGetError();
    glu::checkError(GVar5,"glGenRenderbuffers(1, &m_colorRbo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBlendTests.cpp"
                    ,0xd8);
    glwBindRenderbuffer(0x8d41,this->m_colorRbo);
    GVar5 = glwGetError();
    glu::checkError(GVar5,"glBindRenderbuffer(GL_RENDERBUFFER, m_colorRbo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBlendTests.cpp"
                    ,0xd9);
    glwRenderbufferStorage(0x8d41,0x8c43,this->m_renderWidth,this->m_renderHeight);
    GVar5 = glwGetError();
    glu::checkError(GVar5,
                    "glRenderbufferStorage(GL_RENDERBUFFER, GL_SRGB8_ALPHA8, m_renderWidth, m_renderHeight)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBlendTests.cpp"
                    ,0xda);
    glwGenFramebuffers(1,&this->m_fbo);
    GVar5 = glwGetError();
    glu::checkError(GVar5,"glGenFramebuffers(1, &m_fbo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBlendTests.cpp"
                    ,0xdc);
    glwBindFramebuffer(0x8d40,this->m_fbo);
    GVar5 = glwGetError();
    glu::checkError(GVar5,"glBindFramebuffer(GL_FRAMEBUFFER, m_fbo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBlendTests.cpp"
                    ,0xdd);
    glwFramebufferRenderbuffer(0x8d40,0x8ce0,0x8d41,this->m_colorRbo);
    GVar5 = glwGetError();
    glu::checkError(GVar5,
                    "glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, m_colorRbo)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBlendTests.cpp"
                    ,0xde);
    iVar4 = extraout_EAX_00;
  }
  return iVar4;
}

Assistant:

void BlendCase::init (void)
{
	bool useRGB = !m_useSrgbFbo && m_context.getRenderTarget().getPixelFormat().alphaBits == 0;

	static const Vec4 baseGradientColors[4] =
	{
		Vec4(0.0f, 0.5f, 1.0f, 0.5f),
		Vec4(0.5f, 0.0f, 0.5f, 1.0f),
		Vec4(0.5f, 1.0f, 0.5f, 0.0f),
		Vec4(1.0f, 0.5f, 0.0f, 0.5f)
	};

	DE_STATIC_ASSERT(DE_LENGTH_OF_ARRAY(m_firstQuad.color) == DE_LENGTH_OF_ARRAY(m_firstQuadInt.color));
	for (int i = 0; i < DE_LENGTH_OF_ARRAY(m_firstQuad.color); i++)
	{
		m_firstQuad.color[i]		= (baseGradientColors[i] - 0.5f) * 0.2f + 0.5f;
		m_firstQuadInt.color[i]		= m_firstQuad.color[i];

		m_secondQuad.color[i]		= (Vec4(1.0f) - baseGradientColors[i] - 0.5f) * 1.0f + 0.5f;
		m_secondQuadInt.color[i]	= m_secondQuad.color[i];
	}

	m_viewportWidth		= de::min<int>(m_renderWidth,	MAX_VIEWPORT_WIDTH);
	m_viewportHeight	= de::min<int>(m_renderHeight,	MAX_VIEWPORT_HEIGHT);

	m_firstQuadInt.posA		= tcu::IVec2(0,						0);
	m_secondQuadInt.posA	= tcu::IVec2(0,						0);
	m_firstQuadInt.posB		= tcu::IVec2(m_viewportWidth-1,		m_viewportHeight-1);
	m_secondQuadInt.posB	= tcu::IVec2(m_viewportWidth-1,		m_viewportHeight-1);

	DE_ASSERT(!m_renderer);
	DE_ASSERT(!m_referenceRenderer);
	DE_ASSERT(!m_refColorBuffer);

	m_renderer				= new QuadRenderer(m_context.getRenderContext(), glu::GLSL_VERSION_300_ES);
	m_referenceRenderer		= new ReferenceQuadRenderer;
	m_refColorBuffer		= new TextureLevel(TextureFormat(m_useSrgbFbo ? TextureFormat::sRGBA : useRGB ? TextureFormat::RGB : TextureFormat::RGBA, TextureFormat::UNORM_INT8),
											   m_viewportWidth, m_viewportHeight);

	m_curParamSetNdx = 0;

	if (m_useSrgbFbo)
	{
		m_testCtx.getLog() << TestLog::Message << "Using FBO of size (" << m_renderWidth << ", " << m_renderHeight << ") with format GL_SRGB8_ALPHA8" << TestLog::EndMessage;

		GLU_CHECK_CALL(glGenRenderbuffers(1, &m_colorRbo));
		GLU_CHECK_CALL(glBindRenderbuffer(GL_RENDERBUFFER, m_colorRbo));
		GLU_CHECK_CALL(glRenderbufferStorage(GL_RENDERBUFFER, GL_SRGB8_ALPHA8, m_renderWidth, m_renderHeight));

		GLU_CHECK_CALL(glGenFramebuffers(1, &m_fbo));
		GLU_CHECK_CALL(glBindFramebuffer(GL_FRAMEBUFFER, m_fbo));
		GLU_CHECK_CALL(glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, m_colorRbo));
	}
}